

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

void __thiscall QByteArray::QByteArray(QByteArray *this,qsizetype size,Initialization param_2)

{
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char *)0x0;
  (this->d).size = 0;
  if (size < 1) {
    local_38.d = (Data *)0x0;
    local_38.ptr = "";
    local_38.size = 0;
    QArrayDataPointer<char>::operator=(&this->d,&local_38);
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (char *)QArrayData::allocate1((QArrayData **)&local_38,size,KeepSize);
    local_38.size = size;
    QArrayDataPointer<char>::operator=(&this->d,&local_38);
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,1,0x10);
      }
    }
    (this->d).ptr[size] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::QByteArray(qsizetype size, Qt::Initialization)
{
    if (size <= 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(size, size);
        Q_CHECK_PTR(d.data());
        d.data()[size] = '\0';
    }
}